

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O2

void __thiscall BronKerbosch::printEdges(BronKerbosch *this,string *filename)

{
  string *__return_storage_ptr__;
  ostream *poVar1;
  BronKerbosch *this_00;
  uint uVar2;
  ulong uVar3;
  undefined1 local_290 [64];
  alignment_set_t node;
  ofstream edgefile;
  
  std::ofstream::ofstream(&edgefile,(string *)filename,_S_out);
  __return_storage_ptr__ = (string *)(local_290 + 0x20);
  for (uVar2 = 0; uVar3 = (ulong)uVar2, uVar3 < (this->super_CliqueFinder).alignment_count;
      uVar2 = uVar2 + 1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&node,(this->vertices_->
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar3);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&edgefile);
    poVar1 = std::operator<<(poVar1,":");
    AlignmentRecord::getName_abi_cxx11_
              (__return_storage_ptr__,
               (this->alignments_).
               super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
    poVar1 = std::operator<<(poVar1,(string *)__return_storage_ptr__);
    std::operator<<(poVar1," ->");
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    this_00 = (BronKerbosch *)local_290;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_290,&node);
    printSet(this_00,(ostream *)&edgefile,(alignment_set_t *)local_290);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_290);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&node);
  }
  std::ofstream::~ofstream(&edgefile);
  return;
}

Assistant:

void BronKerbosch::printEdges(std::string filename) {
    ofstream edgefile(filename, ofstream::out);

    for(unsigned int i = 0; i < alignment_count; i++) {
        alignment_set_t node = (*vertices_)[i];
        edgefile << i << ":" << alignments_[i]->getName() << " ->";
        
        printSet(edgefile, node);
    }
}